

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall
bloom_tests::merkle_block_3_and_serialize::test_method(merkle_block_3_and_serialize *this)

{
  long lVar1;
  bool bVar2;
  readonly_property65 rVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  check_type cVar8;
  char *local_468;
  char *local_460;
  equal_coll_impl local_451;
  assertion_result local_450;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  assertion_result local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2b0;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  DataStream stream;
  CBloomFilter filter;
  array<std::byte,_119UL> expected;
  byte local_1b1 [9];
  undefined1 local_1a8 [8];
  element_type *peStack_1a0;
  shared_count sStack_198;
  assertion_result *local_190;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  memcpy(&merkleBlock,
         _ZTAXtlN4util12hex_literals6detail3HexILm433EEEtlSt5arrayISt4byteLm216EEtlA216_S5_LS5_1ELS5_0ELS5_0ELS5_0ELS5_121ELS5_205ELS5_168ELS5_86ELS5_177ELS5_67ELS5_217ELS5_219ELS5_44ELS5_28ELS5_175ELS5_240ELS5_29ELS5_26ELS5_236ELS5_200ELS5_99ELS5_13ELS5_48ELS5_98ELS5_93ELS5_16ELS5_232ELS5_180ELS5_184ELS5_176ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_181ELS5_12ELS5_192ELS5_105ELS5_214ELS5_163ELS5_227ELS5_62ELS5_63ELS5_248ELS5_74ELS5_92ELS5_65ELS5_217ELS5_211ELS5_254ELS5_190ELS5_124ELS5_119ELS5_15ELS5_220ELS5_201ELS5_107ELS5_44ELS5_63ELS5_246ELS5_10ELS5_190ELS5_24ELS5_79ELS5_25ELS5_99ELS5_103ELS5_41ELS5_27ELS5_77ELS5_76ELS5_134ELS5_4ELS5_27ELS5_143ELS5_164ELS5_93ELS5_99ELS5_1ELS5_1ELS5_0ELS5_0ELS5_0ELS5_1ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_255ELS5_255ELS5_255ELS5_255ELS5_8ELS5_4ELS5_76ELS5_134ELS5_4ELS5_27ELS5_2ELS5_10ELS5_2ELS5_255ELS5_255ELS5_255ELS5_255ELS5_1ELS5_0ELS5_242ELS5_5ELS5_42ELS5_1ELS5_0ELS5_0ELS5_0ELS5_67ELS5_65ELS5_4ELS5_236ELS5_211ELS5_34ELS5_155ELS5_5ELS5_113ELS5_195ELS5_190ELS5_135ELS5_111ELS5_234ELS5_172ELS5_4ELS5_66ELS5_169ELS5_241ELS5_60ELS5_90ELS5_87ELS5_39ELS5_66ELS5_146ELS5_122ELS5_241ELS5_220ELS5_98ELS5_51ELS5_83ELS5_236ELS5_248ELS5_194ELS5_2ELS5_34ELS5_95ELS5_100ELS5_134ELS5_129ELS5_55ELS5_161ELS5_140ELS5_221ELS5_133ELS5_203ELS5_187ELS5_76ELS5_116ELS5_251ELS5_204ELS5_253ELS5_79ELS5_73ELS5_99ELS5_156ELS5_241ELS5_189ELS5_201ELS5_74ELS5_86ELS5_114ELS5_187ELS5_21ELS5_173ELS5_93ELS5_76ELS5_172EEEEE
         ,0xd8);
  sp.m_size = 0xd8;
  sp.m_data = (byte *)&merkleBlock;
  DataStream::DataStream(&stream,sp);
  merkleBlock.header._0_8_ = &::TX_WITH_WITNESS;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ = &block;
  ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CBlock> *)&merkleBlock,&stream);
  CBloomFilter::CBloomFilter(&filter,10,1e-06,0,'\x01');
  merkleBlock.header.nVersion = 0x69c00cb5;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xd6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 0xa3;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0xe3;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '>';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '?';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xf8;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 'J';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\\';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 'A';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xd9;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xd3;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0xfe;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xbe;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '|';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 'w';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\x0f';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0xdc;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xc9;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 'k';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = ',';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '?';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0xf6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\n';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xbe;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\x18';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 'O';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\x19';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 'c';
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&merkleBlock;
  CBloomFilter::insert(&filter,vKey);
  CMerkleBlock::CMerkleBlock(&merkleBlock,&block,&filter);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x154;
  file.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_290,msg);
  CBlockHeader::GetHash((uint256 *)&expected,&merkleBlock.header);
  CBlockHeader::GetHash((uint256 *)local_1a8,&block.super_CBlockHeader);
  bVar2 = ::operator==((base_blob<256U> *)&expected,(base_blob<256U> *)local_1a8);
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b0 = &vIndex;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_3d55f9;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xb65be0;
  local_2c8.m_message.px = (element_type *)((ulong)local_2c8.m_message.px & 0xffffffffffffff00);
  local_2c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vMatched,(lazy_ostream *)&local_2c8,1,0,WARN,_cVar8,
             (size_t)&local_2d8,0x154);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x156;
  file_00.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f8,
             msg_00);
  local_1a8[0] = (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x24;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "merkleBlock.vMatchedTxn.size() == 1";
  local_2c8.m_message.px = (element_type *)0xb65cf1;
  expected._M_elems._8_8_ = expected._M_elems._8_8_ & 0xffffffffffffff00;
  expected._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  expected._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_300 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  expected._M_elems._24_8_ = (lazy_ostream *)&local_2c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)&expected,1,0,WARN,_cVar8,
             (size_t)&local_308,0x156);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x158;
  file_01.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_328,
             msg_01);
  expected._M_elems[0] = 0xb5;
  expected._M_elems[1] = 0xc;
  expected._M_elems[2] = 0xc0;
  expected._M_elems[3] = 0x69;
  expected._M_elems[4] = 0xd6;
  expected._M_elems[5] = 0xa3;
  expected._M_elems[6] = 0xe3;
  expected._M_elems[7] = 0x3e;
  expected._M_elems[8] = 0x3f;
  expected._M_elems[9] = 0xf8;
  expected._M_elems[10] = 0x4a;
  expected._M_elems[0xb] = 0x5c;
  expected._M_elems[0xc] = 0x41;
  expected._M_elems[0xd] = 0xd9;
  expected._M_elems[0xe] = 0xd3;
  expected._M_elems[0xf] = 0xfe;
  expected._M_elems[0x10] = 0xbe;
  expected._M_elems[0x11] = 0x7c;
  expected._M_elems[0x12] = 0x77;
  expected._M_elems[0x13] = 0xf;
  expected._M_elems[0x14] = 0xdc;
  expected._M_elems[0x15] = 0xc9;
  expected._M_elems[0x16] = 0x6b;
  expected._M_elems[0x17] = 0x2c;
  expected._M_elems[0x18] = 0x3f;
  expected._M_elems[0x19] = 0xf6;
  expected._M_elems[0x1a] = 10;
  expected._M_elems[0x1b] = 0xbe;
  expected._M_elems[0x1c] = 0x18;
  expected._M_elems[0x1d] = 0x4f;
  expected._M_elems[0x1e] = 0x19;
  expected._M_elems[0x1f] = 99;
  bVar2 = ::operator==(&((merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->second).super_base_blob<256U>,
                       (base_blob<256U> *)&expected);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_3d572e;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb660fd;
  peStack_1a0 = (element_type *)((ulong)peStack_1a0 & 0xffffffffffffff00);
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_198.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_330 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_190 = (assertion_result *)&vMatched;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar8,(size_t)&local_338,0x158);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x159;
  file_02.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_358,
             msg_02);
  local_1a8[0] = (merkleBlock.vMatchedTxn.
                  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first == 0;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "merkleBlock.vMatchedTxn[0].first == 0";
  local_2c8.m_message.px = (element_type *)0xb65d88;
  expected._M_elems._8_8_ = expected._M_elems._8_8_ & 0xffffffffffffff00;
  expected._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  expected._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_360 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  expected._M_elems._24_8_ = &local_2c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)&expected,1,0,WARN,_cVar8,
             (size_t)&local_368,0x159);
  boost::detail::shared_count::~shared_count(&sStack_198);
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x15d;
  file_03.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
             msg_03);
  CPartialMerkleTree::ExtractMatches((uint256 *)&expected,&merkleBlock.txn,&vMatched,&vIndex);
  bVar2 = ::operator==((base_blob<256U> *)&expected,
                       &block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>);
  local_2c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_2c8.m_message.px = (element_type *)0x0;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = &local_450;
  local_450._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_450.m_message.px = (element_type *)0xb65b4d;
  peStack_1a0 = (element_type *)((ulong)peStack_1a0 & 0xffffffffffffff00);
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  sStack_198.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar8,(size_t)&local_3b8,0x15d);
  boost::detail::shared_count::~shared_count(&local_2c8.m_message.pn);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x15e;
  file_04.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d8,
             msg_04);
  local_1a8[0] = (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5 ==
                 ((long)merkleBlock.vMatchedTxn.
                        super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_2c8._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_2c8.m_message.px = (element_type *)0xb65b7f;
  expected._M_elems._8_8_ = expected._M_elems._8_8_ & 0xffffffffffffff00;
  expected._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  expected._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  expected._M_elems._24_8_ = &local_2c8;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_3e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)&expected,1,0,WARN,_cVar8,
             (size_t)&local_3e8,0x15e);
  boost::detail::shared_count::~shared_count(&sStack_198);
  for (uVar6 = 0; uVar7 = (ulong)uVar6,
      uVar7 < (ulong)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
    local_3f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_3f0 = "";
    local_408 = &boost::unit_test::basic_cstring<char_const>::null;
    local_400 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar5;
    msg_05.m_begin = pvVar4;
    file_05.m_end = (iterator)0x160;
    file_05.m_begin = (iterator)&local_3f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_408,
               msg_05);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==(&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7].super_base_blob<256U>,
                      &merkleBlock.vMatchedTxn.
                       super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].second.super_base_blob<256U>
                     );
    local_1a8[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    peStack_1a0 = (element_type *)0x0;
    sStack_198.pi_ = (sp_counted_base *)0x0;
    local_2c8._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
    local_2c8.m_message.px = (element_type *)0xb65bb0;
    expected._M_elems._8_8_ = expected._M_elems._8_8_ & 0xffffffffffffff00;
    expected._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    expected._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    expected._M_elems._24_8_ = &local_2c8;
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_410 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1a8,(lazy_ostream *)&expected,1,0,WARN,_cVar8,
               (size_t)&local_418,0x160);
    boost::detail::shared_count::~shared_count(&sStack_198);
  }
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_190 = (assertion_result *)0x0;
  local_1a8 = (undefined1  [8])0x0;
  peStack_1a0 = (element_type *)0x0;
  CMerkleBlock::SerializationOps<DataStream,CMerkleBlock_const,ActionSerialize>(&merkleBlock);
  memcpy(&expected,&DAT_00b66614,0x77);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x166;
  file_06.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_438,
             msg_06);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_450,&local_451,(byte *)((long)local_1a8 + (long)local_190),
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )peStack_1a0,expected._M_elems,local_1b1);
  local_2c8.m_message.px = (element_type *)((ulong)local_2c8.m_message.px & 0xffffffffffffff00);
  local_2c8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2b0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xc694e1;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_460 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_450,(lazy_ostream *)&local_2c8,1,0xd,4,0xb660fe,(size_t)&local_468,0x166,
             "merkleStream.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_450.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_1a8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CMerkleBlock::~CMerkleBlock(&merkleBlock);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_3_and_serialize)
{
    // Random real block (000000000000dab0130bbcc991d3d7ae6b81aa6f50a798888dfe62337458dc45)
    // With one tx
    CBlock block;
    DataStream stream{
        "0100000079cda856b143d9db2c1caff01d1aecc8630d30625d10e8b4b8b0000000000000b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f196367291b4d4c86041b8fa45d630101000000010000000000000000000000000000000000000000000000000000000000000000ffffffff08044c86041b020a02ffffffff0100f2052a01000000434104ecd3229b0571c3be876feaac0442a9f13c5a572742927af1dc623353ecf8c202225f64868137a18cdd85cbbb4c74fbccfd4f49639cf1bdc94a5672bb15ad5d4cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the only transaction
    filter.insert(uint256{"63194f18be0af63f2c6bc9dc0f777cbefed3d9415c4af83f3ee3a3d669c00cb5"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"63194f18be0af63f2c6bc9dc0f777cbefed3d9415c4af83f3ee3a3d669c00cb5"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    DataStream merkleStream{};
    merkleStream << merkleBlock;

    constexpr auto expected{"0100000079cda856b143d9db2c1caff01d1aecc8630d30625d10e8b4b8b0000000000000b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f196367291b4d4c86041b8fa45d630100000001b50cc069d6a3e33e3ff84a5c41d9d3febe7c770fdcc96b2c3ff60abe184f19630101"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(merkleStream.begin(), merkleStream.end(), expected.begin(), expected.end());
}